

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O0

deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
* __thiscall
tchecker::algorithms::couvscc::
generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::
expand_node(deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
            *__return_storage_ptr__,
           generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>
           *this,node_sptr_t *n,zg_t *ts,graph_t *graph,stats_t *stats)

{
  bool bVar1;
  unsigned_long *puVar2;
  __tuple_element_t<1UL,_tuple<bool,_intrusive_shared_ptr_t<make_shared_t<node_t<node_t,_edge_t>,_unsigned_long,_1UL>_>_>_>
  *n2;
  make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *args;
  type *nextn;
  type_conflict1 *new_node;
  tuple<bool,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
  *local_b0;
  __tuple_element_t<2UL,_tuple<unsigned_int,_intrusive_shared_ptr_t<make_shared_t<state_t,_unsigned_long,_1UL>_>,_intrusive_shared_ptr_t<make_shared_t<transition_t,_unsigned_long,_1UL>_>_>_>
  *local_a8;
  type *t;
  type *s;
  type_conflict2 *status;
  __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
  local_88;
  iterator __end0;
  iterator __begin0;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *__range3;
  node_zg_state_t local_60;
  undefined1 local_58 [8];
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  v;
  stats_t *stats_local;
  graph_t *graph_local;
  zg_t *ts_local;
  node_sptr_t *n_local;
  generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>
  *this_local;
  deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
  *next_nodes;
  
  v.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::deque(__return_storage_ptr__);
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::vector((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
            *)local_58);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::operator->(n);
  tchecker::graph::node_zg_state_t::state_ptr(&local_60);
  zg::zg_t::next(ts,&local_60._state,
                 (vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
                  *)local_58,1);
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_60._state);
  __end0 = std::
           vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
           ::begin((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
                    *)local_58);
  local_88._M_current =
       (tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
        *)std::
          vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
          ::end((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
                 *)local_58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&local_88);
    if (!bVar1) break;
    status = (type_conflict2 *)
             __gnu_cxx::
             __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
             ::operator*(&__end0);
    s = (type *)std::
                get<0ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>>
                          ((tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
                            *)status);
    t = (type *)std::
                get<1ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>>
                          ((tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
                            *)status);
    local_a8 = std::
               get<2ul,unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>>
                         ((tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
                           *)status);
    puVar2 = stats_t::visited_transitions(stats);
    *puVar2 = *puVar2 + 1;
    tchecker::graph::reachability::
    graph_t<tchecker::tck_liveness::zg_couvscc::node_t,tchecker::tck_liveness::zg_couvscc::edge_t,tchecker::tck_liveness::zg_couvscc::node_hash_t,tchecker::tck_liveness::zg_couvscc::node_equal_to_t>
    ::
    add_node<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>&>
              ((graph_t<tchecker::tck_liveness::zg_couvscc::node_t,tchecker::tck_liveness::zg_couvscc::edge_t,tchecker::tck_liveness::zg_couvscc::node_hash_t,tchecker::tck_liveness::zg_couvscc::node_equal_to_t>
                *)&new_node,
               (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                *)graph);
    local_b0 = (tuple<bool,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                *)&new_node;
    std::
    get<0ul,bool,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,tchecker::tck_liveness::zg_couvscc::edge_t>,unsigned_long,1ul>>>
              (local_b0);
    n2 = std::
         get<1ul,bool,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,tchecker::tck_liveness::zg_couvscc::edge_t>,unsigned_long,1ul>>>
                   (local_b0);
    args = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
           ::operator*(local_a8);
    tchecker::graph::reachability::
    graph_t<tchecker::tck_liveness::zg_couvscc::node_t,tchecker::tck_liveness::zg_couvscc::edge_t,tchecker::tck_liveness::zg_couvscc::node_hash_t,tchecker::tck_liveness::zg_couvscc::node_equal_to_t>
    ::add_edge<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>&>
              ((graph_t<tchecker::tck_liveness::zg_couvscc::node_t,tchecker::tck_liveness::zg_couvscc::edge_t,tchecker::tck_liveness::zg_couvscc::node_hash_t,tchecker::tck_liveness::zg_couvscc::node_equal_to_t>
                *)graph,n,n2,args);
    std::
    deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
    ::push_back(__return_storage_ptr__,n2);
    std::
    tuple<bool,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
    ::~tuple((tuple<bool,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
              *)&new_node);
    __gnu_cxx::
    __normal_iterator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_*,_std::vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>_>
    ::operator++(&__end0);
  }
  v.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::~vector((vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
             *)local_58);
  if ((v.
       super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
    ::~deque(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::deque<node_sptr_t> expand_node(node_sptr_t & n, TS & ts, GRAPH & graph, tchecker::algorithms::couvscc::stats_t & stats)
  {
    std::deque<node_sptr_t> next_nodes;
    std::vector<typename TS::sst_t> v;
    ts.next(n->state_ptr(), v);
    for (auto && [status, s, t] : v) {
      ++stats.visited_transitions();
      auto && [new_node, nextn] = graph.add_node(s);
      graph.add_edge(n, nextn, *t);
      next_nodes.push_back(nextn);
    }
    return next_nodes;
  }